

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O2

void __thiscall
cmServerProtocol1::GeneratorInformation::SetupGenerator
          (GeneratorInformation *this,cmake *cm,string *errorMessage)

{
  cmGlobalGenerator *gg;
  string fullGeneratorName;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  cmExternalMakefileProjectGenerator::CreateFullGeneratorName
            (&local_38,&this->GeneratorName,&this->ExtraGeneratorName);
  cmake::SetHomeDirectory(cm,&this->SourceDirectory);
  cmake::SetHomeOutputDirectory(cm,&this->BuildDirectory);
  gg = cmake::CreateGlobalGenerator(cm,&local_38);
  if (gg == (cmGlobalGenerator *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"Could not set up the requested combination of \"",&local_d9);
    std::operator+(&local_b8,&local_d8,&kGENERATOR_KEY_abi_cxx11_);
    std::operator+(&local_98,&local_b8,"\" and \"");
    std::operator+(&local_78,&local_98,&kEXTRA_GENERATOR_KEY_abi_cxx11_);
    std::operator+(&local_58,&local_78,"\"");
    setErrorMessage(errorMessage,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  else {
    cmake::SetGlobalGenerator(cm,gg);
    cmake::SetGeneratorToolset(cm,&this->Toolset);
    cmake::SetGeneratorPlatform(cm,&this->Platform);
  }
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void cmServerProtocol1::GeneratorInformation::SetupGenerator(
  cmake* cm, std::string* errorMessage)
{
  const std::string fullGeneratorName =
    cmExternalMakefileProjectGenerator::CreateFullGeneratorName(
      GeneratorName, ExtraGeneratorName);

  cm->SetHomeDirectory(SourceDirectory);
  cm->SetHomeOutputDirectory(BuildDirectory);

  cmGlobalGenerator* gg = cm->CreateGlobalGenerator(fullGeneratorName);
  if (!gg) {
    setErrorMessage(
      errorMessage,
      std::string("Could not set up the requested combination of \"") +
        kGENERATOR_KEY + "\" and \"" + kEXTRA_GENERATOR_KEY + "\"");
    return;
  }

  cm->SetGlobalGenerator(gg);

  cm->SetGeneratorToolset(Toolset);
  cm->SetGeneratorPlatform(Platform);
}